

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Checkbox(char *label,bool *v)

{
  bool bVar1;
  ImGuiWindowTempData *min;
  byte *in_RSI;
  float _y;
  float fVar2;
  float pad;
  float check_sz;
  bool pressed;
  bool held;
  bool hovered;
  ImRect text_bb;
  ImRect total_bb;
  ImRect check_bb;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe68;
  ImRect *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  char *in_stack_fffffffffffffe80;
  ImVec2 *pIVar3;
  float in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  ImGuiWindow *in_stack_fffffffffffffe90;
  ImRect *this;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  float in_stack_fffffffffffffea4;
  ImRect *in_stack_fffffffffffffea8;
  undefined1 hide_text_after_hash;
  ImRect *in_stack_fffffffffffffeb0;
  ImRect *in_stack_fffffffffffffeb8;
  ImVec2 pos;
  undefined1 in_stack_fffffffffffffed3;
  float fVar4;
  ImVec2 p_max;
  ImVec2 p_min;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImGuiNavHighlightFlags in_stack_ffffffffffffff18;
  ImGuiID in_stack_ffffffffffffff1c;
  ImRect *in_stack_ffffffffffffff20;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImRect local_bc;
  ImRect local_ac;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImRect local_7c;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImRect local_4c;
  ImVec2 local_3c;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  byte *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_34 = ImGuiWindow::GetID(in_stack_fffffffffffffe90,
                                  (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                   in_stack_fffffffffffffe88),
                                  in_stack_fffffffffffffe80);
    local_3c = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            (char *)in_stack_fffffffffffffe90,
                            SUB41((uint)in_stack_fffffffffffffe8c >> 0x18,0),
                            in_stack_fffffffffffffe88);
    min = &local_20->DC;
    fVar2 = (local_30->FramePadding).y;
    fVar2 = fVar2 + fVar2 + local_3c.y;
    ImVec2::ImVec2(&local_5c,fVar2,fVar2);
    local_54 = operator+(in_stack_fffffffffffffe68,(ImVec2 *)0x17d9de);
    ImRect::ImRect(&local_4c,&min->CursorPos,&local_54);
    ItemSize(in_stack_fffffffffffffe70,(float)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    local_6c = local_4c.Min;
    local_64 = local_4c.Max;
    if (0.0 < local_3c.x) {
      SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),SUB84(in_stack_fffffffffffffe70,0))
      ;
    }
    pos = (ImVec2)&local_20->DC;
    pIVar3 = &local_8c;
    fVar4 = 0.0;
    ImVec2::ImVec2(pIVar3,0.0,(local_30->FramePadding).y);
    fVar2 = (float)((ulong)pIVar3 >> 0x20);
    local_84 = operator+(in_stack_fffffffffffffe68,(ImVec2 *)0x17daae);
    p_max = (ImVec2)&local_20->DC;
    p_min = (ImVec2)&local_ac.Max;
    ImVec2::ImVec2((ImVec2 *)p_min,fVar4,(local_30->FramePadding).y);
    local_9c = operator+(in_stack_fffffffffffffe68,(ImVec2 *)0x17db01);
    local_94 = operator+(in_stack_fffffffffffffe68,(ImVec2 *)0x17db1f);
    ImRect::ImRect(&local_7c,&local_84,&local_94);
    if (0.0 < local_3c.x) {
      in_stack_fffffffffffffeb8 = &local_7c;
      in_stack_fffffffffffffea4 = ImRect::GetWidth(in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffeb0 = &local_4c;
      _y = ImRect::GetHeight(in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffea8 = &local_ac;
      ImVec2::ImVec2(&in_stack_fffffffffffffea8->Min,in_stack_fffffffffffffea4,_y);
      ItemSize((ImVec2 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      local_c4 = ImMin((ImVec2 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       &in_stack_fffffffffffffe70->Min);
      local_cc = ImMax((ImVec2 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       &in_stack_fffffffffffffe70->Min);
      ImRect::ImRect(&local_bc,&local_c4,&local_cc);
      local_6c = local_bc.Min;
      local_64 = local_bc.Max;
    }
    bVar1 = ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                    (ImGuiID)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                    (ImRect *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar1) {
      bVar1 = ButtonBehavior(in_stack_fffffffffffffea8,(ImGuiID)in_stack_fffffffffffffea4,
                             (bool *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                             (bool *)in_stack_fffffffffffffe90,
                             (ImGuiButtonFlags)in_stack_fffffffffffffe8c);
      hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
      if (bVar1) {
        *local_18 = (*local_18 ^ 0xff) & 1;
        MarkItemEdited(local_34);
      }
      RenderNavHighlight(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                         in_stack_ffffffffffffff18);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                  SUB84(in_stack_fffffffffffffe80,0));
      RenderFrame(p_min,p_max,(ImU32)fVar4,(bool)in_stack_fffffffffffffed3,fVar2);
      if ((*local_18 & 1) != 0) {
        this = &local_4c;
        fVar2 = ImRect::GetWidth(this);
        fVar4 = ImRect::GetHeight(this);
        fVar2 = ImMin<float>(fVar2,fVar4);
        fVar2 = ImMax<float>(1.0,(float)(int)(fVar2 / 6.0));
        pIVar3 = &local_f8;
        ImVec2::ImVec2(pIVar3,fVar2,fVar2);
        local_f0 = operator+(in_stack_fffffffffffffe68,(ImVec2 *)0x17de10);
        GetColorU32((ImGuiCol)((ulong)pIVar3 >> 0x20),SUB84(pIVar3,0));
        ImRect::GetWidth(this);
        RenderCheckMark(pos,(ImU32)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                        SUB84(in_stack_fffffffffffffeb8,0));
      }
      if ((local_28->LogEnabled & 1U) != 0) {
        LogRenderedText((ImVec2 *)pos,(char *)in_stack_fffffffffffffeb8,
                        (char *)in_stack_fffffffffffffeb0);
      }
      local_1 = bVar1;
      if (0.0 < local_3c.x) {
        RenderText(pos,(char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                   (bool)hide_text_after_hash);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Checkbox(const char* label, bool* v)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const ImRect check_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(label_size.y + style.FramePadding.y*2, label_size.y + style.FramePadding.y*2)); // We want a square shape to we use Y twice
    ItemSize(check_bb, style.FramePadding.y);

    ImRect total_bb = check_bb;
    if (label_size.x > 0)
        SameLine(0, style.ItemInnerSpacing.x);
    const ImRect text_bb(window->DC.CursorPos + ImVec2(0,style.FramePadding.y), window->DC.CursorPos + ImVec2(0,style.FramePadding.y) + label_size);
    if (label_size.x > 0)
    {
        ItemSize(ImVec2(text_bb.GetWidth(), check_bb.GetHeight()), style.FramePadding.y);
        total_bb = ImRect(ImMin(check_bb.Min, text_bb.Min), ImMax(check_bb.Max, text_bb.Max));
    }

    if (!ItemAdd(total_bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
    {
        *v = !(*v);
        MarkItemEdited(id);
    }

    RenderNavHighlight(total_bb, id);
    RenderFrame(check_bb.Min, check_bb.Max, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), true, style.FrameRounding);
    if (*v)
    {
        const float check_sz = ImMin(check_bb.GetWidth(), check_bb.GetHeight());
        const float pad = ImMax(1.0f, (float)(int)(check_sz / 6.0f));
        RenderCheckMark(check_bb.Min + ImVec2(pad,pad), GetColorU32(ImGuiCol_CheckMark), check_bb.GetWidth() - pad*2.0f);
    }

    if (g.LogEnabled)
        LogRenderedText(&text_bb.Min, *v ? "[x]" : "[ ]");
    if (label_size.x > 0.0f)
        RenderText(text_bb.Min, label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Checkable | (*v ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}